

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *
slang::syntax::deepClone<slang::syntax::FunctionPortBaseSyntax>
          (SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *node,BumpAllocator *alloc)

{
  Token token;
  bool bVar1;
  size_t sVar2;
  SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *pSVar3;
  EVP_PKEY_CTX *src;
  BumpAllocator *this;
  Token *in_RSI;
  ConstTokenOrSyntax *ele;
  iterator __end0;
  iterator __begin0;
  span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL> *__range2;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> buffer;
  SyntaxNode *in_stack_fffffffffffffe98;
  SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *in_stack_fffffffffffffea0;
  span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL> *in_stack_fffffffffffffea8;
  Info *in_stack_fffffffffffffeb0;
  __normal_iterator<const_slang::syntax::ConstTokenOrSyntax_*,_std::span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL>_>
  local_90 [3];
  span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL> local_78;
  span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL> *local_68;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_58;
  BumpAllocator *in_stack_ffffffffffffffe8;
  
  sVar2 = SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::size
                    ((SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *)0x7bec54);
  SmallVector<slang::syntax::TokenOrSyntax,_2UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_2UL> *)&local_58,sVar2);
  local_78 = SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::elems
                       (in_stack_fffffffffffffea0);
  local_68 = &local_78;
  local_90[0]._M_current =
       (ConstTokenOrSyntax *)
       std::span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL>::begin
                 ((span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL> *)
                  in_stack_fffffffffffffe98);
  std::span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL>::end
            (in_stack_fffffffffffffea8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::syntax::ConstTokenOrSyntax_*,_std::span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::syntax::ConstTokenOrSyntax_*,_std::span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffea0,
                       (__normal_iterator<const_slang::syntax::ConstTokenOrSyntax_*,_std::span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffe98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::syntax::ConstTokenOrSyntax_*,_std::span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL>_>
    ::operator*(local_90);
    bVar1 = ConstTokenOrSyntax::isToken((ConstTokenOrSyntax *)0x7bed13);
    if (bVar1) {
      ConstTokenOrSyntax::token((ConstTokenOrSyntax *)in_stack_fffffffffffffe98);
      parsing::Token::deepClone(in_RSI,in_stack_ffffffffffffffe8);
      token.info = in_stack_fffffffffffffeb0;
      token._0_8_ = in_stack_fffffffffffffea8;
      TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_stack_fffffffffffffea0,token);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffea0,
                 (TokenOrSyntax *)in_stack_fffffffffffffe98);
    }
    else {
      ConstTokenOrSyntax::node((ConstTokenOrSyntax *)0x7bedf5);
      deepClone((SyntaxNode *)in_stack_fffffffffffffea0,(BumpAllocator *)in_stack_fffffffffffffe98);
      TokenOrSyntax::TokenOrSyntax
                ((TokenOrSyntax *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffea0,
                 (TokenOrSyntax *)in_stack_fffffffffffffe98);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::syntax::ConstTokenOrSyntax_*,_std::span<const_slang::syntax::ConstTokenOrSyntax,_18446744073709551615UL>_>
    ::operator++(local_90);
  }
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy(&local_58,(EVP_PKEY_CTX *)in_RSI,src);
  pSVar3 = BumpAllocator::
           emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>>
                     (this,(span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)in_RSI);
  SmallVector<slang::syntax::TokenOrSyntax,_2UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_2UL> *)0x7beead);
  return pSVar3;
}

Assistant:

SeparatedSyntaxList<T>* deepClone(const SeparatedSyntaxList<T>& node, BumpAllocator& alloc) {
    SmallVector<TokenOrSyntax> buffer(node.size(), UninitializedTag());
    for (const auto& ele : node.elems()) {
        if (ele.isToken())
            buffer.push_back(ele.token().deepClone(alloc));
        else
            buffer.push_back(static_cast<T*>(deepClone(*ele.node(), alloc)));
    }
    return alloc.emplace<SeparatedSyntaxList<T>>(buffer.copy(alloc));
}